

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

double __thiscall
CBlockPolicyEstimator::estimateConservativeFee
          (CBlockPolicyEstimator *this,uint doubleTarget,EstimationResult *result)

{
  TxConfirmStats *pTVar1;
  long lVar2;
  EstimationResult *pEVar3;
  EstimationResult *pEVar4;
  long in_FS_OFFSET;
  byte bVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  EstimationResult local_98;
  long local_20;
  
  bVar5 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.pass.start = -1.0;
  local_98.pass.end = -1.0;
  local_98.pass.withinTarget = 0.0;
  local_98.pass.totalConfirmed = 0.0;
  local_98.pass.inMempool = 0.0;
  local_98.pass.leftMempool = 0.0;
  local_98.fail.start = -1.0;
  local_98.fail.end = -1.0;
  local_98.fail.withinTarget = 0.0;
  local_98.fail.totalConfirmed = 0.0;
  local_98.fail.inMempool = 0.0;
  local_98.fail.leftMempool._0_4_ = 0;
  local_98.fail.leftMempool._4_4_ = 0;
  local_98.decay._0_4_ = 0;
  local_98._100_8_ = 0;
  pTVar1 = (this->shortStats)._M_t.
           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
           super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  if ((int)((ulong)((long)*(pointer *)
                           ((long)&(pTVar1->confAvg).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           + 8) -
                   *(long *)&(pTVar1->confAvg).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl) >> 3) * pTVar1->scale * -0x55555555 < doubleTarget) {
    uVar7 = 0;
    uVar8 = 0xbff00000;
  }
  else {
    dVar6 = TxConfirmStats::EstimateMedianVal
                      ((this->feeStats)._M_t.
                       super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                       .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,doubleTarget,0.1
                       ,0.95,this->nBestSeenHeight,result);
    uVar7 = SUB84(dVar6,0);
    uVar8 = (undefined4)((ulong)dVar6 >> 0x20);
  }
  pTVar1 = (this->feeStats)._M_t.
           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
           super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  if (doubleTarget <=
      (int)((ulong)((long)*(pointer *)
                           ((long)&(pTVar1->confAvg).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           + 8) -
                   *(long *)&(pTVar1->confAvg).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl) >> 3) * pTVar1->scale * -0x55555555) {
    dVar6 = TxConfirmStats::EstimateMedianVal
                      ((this->longStats)._M_t.
                       super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                       .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,doubleTarget,0.1
                       ,0.95,this->nBestSeenHeight,&local_98);
    if ((double)CONCAT44(uVar8,uVar7) < dVar6) {
      if (result != (EstimationResult *)0x0) {
        pEVar3 = &local_98;
        pEVar4 = result;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pEVar4->pass).start = (pEVar3->pass).start;
          pEVar3 = (EstimationResult *)((long)pEVar3 + ((ulong)bVar5 * -2 + 1) * 8);
          pEVar4 = (EstimationResult *)((long)pEVar4 + (ulong)bVar5 * -0x10 + 8);
        }
        result->scale = local_98.scale;
      }
      uVar7 = SUB84(dVar6,0);
      uVar8 = (undefined4)((ulong)dVar6 >> 0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (double)CONCAT44(uVar8,uVar7);
  }
  __stack_chk_fail();
}

Assistant:

double CBlockPolicyEstimator::estimateConservativeFee(unsigned int doubleTarget, EstimationResult *result) const
{
    double estimate = -1;
    EstimationResult tempResult;
    if (doubleTarget <= shortStats->GetMaxConfirms()) {
        estimate = feeStats->EstimateMedianVal(doubleTarget, SUFFICIENT_FEETXS, DOUBLE_SUCCESS_PCT, nBestSeenHeight, result);
    }
    if (doubleTarget <= feeStats->GetMaxConfirms()) {
        double longEstimate = longStats->EstimateMedianVal(doubleTarget, SUFFICIENT_FEETXS, DOUBLE_SUCCESS_PCT, nBestSeenHeight, &tempResult);
        if (longEstimate > estimate) {
            estimate = longEstimate;
            if (result) *result = tempResult;
        }
    }
    return estimate;
}